

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meassure_recv.c
# Opt level: O2

void * receiver(void *_)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  timespec t0;
  
  clock_gettime(1,(timespec *)&t0);
  sVar3 = 1;
  while( true ) {
    sched_yield();
    sVar2 = (*meassure)(__cxa_finalize);
    payload[sVar3 - 1] = sVar2;
    if (sVar3 == length) break;
    uVar1 = (int)t0.tv_nsec + (int)interval;
    if (999999999 < uVar1) {
      uVar1 = uVar1 + 0xc4653600;
      t0.tv_sec = t0.tv_sec + 1;
    }
    t0.tv_nsec = (__syscall_slong_t)uVar1;
    clock_nanosleep(1,1,(timespec *)&t0,(timespec *)0x0);
    sVar3 = sVar3 + 1;
  }
  return (void *)0x0;
}

Assistant:

void* receiver(void* _)
{
    INIT_CLOCK
    int i = 0;

    while(1)
    {
        sched_yield();
        size_t d = meassure(function + 64);

        payload[i++] = d;

        if(i == length)
            return NULL;

        WAIT_FOR_CLOCK
    }
}